

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool __thiscall
despot::Parser::IsSelfLoopingWithoutReward(Parser *this,vector<int,_std::allocator<int>_> *state)

{
  set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  pointer pSVar1;
  pointer pSVar2;
  CPT *pCVar3;
  iterator iVar4;
  pointer pNVar5;
  pointer piVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  pointer pFVar11;
  long lVar12;
  int iVar13;
  double extraout_XMM0_Qa;
  double dVar14;
  pair<std::_Rb_tree_iterator<std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_iterator<std::vector<int,_std::allocator<int>_>_>_>
  pVar15;
  
  this_00 = &this->selfloop_state_set_;
  iVar4 = std::
          _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::find(&this_00->_M_t,state);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header) {
    piVar6 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar8 = (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar6;
    if (lVar8 != 0) {
      lVar8 = lVar8 >> 2;
      pSVar1 = (this->prev_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = (this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0x14;
      lVar12 = 0;
      do {
        iVar13 = piVar6[lVar12];
        *(int *)((long)&(pSVar1->super_NamedVar).super_Variable._vptr_Variable + lVar10 * 4) =
             iVar13;
        *(int *)((long)&(pSVar2->super_NamedVar).super_Variable._vptr_Variable + lVar10 * 4) =
             iVar13;
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 0x30;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar12);
    }
    pNVar5 = (this->action_vars_).
             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(pNVar5->super_Variable).values_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         *(long *)&(pNVar5->super_Variable).values_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data) >> 5)) {
      iVar13 = 0;
      do {
        (pNVar5->super_Variable).curr_value = iVar13;
        piVar6 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish != piVar6) {
          uVar9 = 0;
          do {
            pCVar3 = (this->transition_funcs_).
                     super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
            (*(pCVar3->super_Function)._vptr_Function[5])(pCVar3,(ulong)(uint)piVar6[uVar9]);
            if (extraout_XMM0_Qa != 1.0) {
              return false;
            }
            if (NAN(extraout_XMM0_Qa)) {
              return false;
            }
            uVar9 = uVar9 + 1;
            piVar6 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar9 < (ulong)((long)(state->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >>
                                  2));
        }
        pFVar11 = (this->reward_funcs_).
                  super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->reward_funcs_).
            super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
            super__Vector_impl_data._M_finish != pFVar11) {
          lVar8 = 0;
          uVar9 = 0;
          do {
            dVar14 = (double)(**(code **)(*(long *)((long)&pFVar11->_vptr_Function + lVar8) + 0x28))
                                       ((long)&pFVar11->_vptr_Function + lVar8,0);
            if ((dVar14 != 0.0) || (NAN(dVar14))) {
              return false;
            }
            uVar9 = uVar9 + 1;
            pFVar11 = (this->reward_funcs_).
                      super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar7 = ((long)(this->reward_funcs_).
                           super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pFVar11 >> 3) *
                    0x2e8ba2e8ba2e8ba3;
            lVar8 = lVar8 + 0x58;
          } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
        }
        iVar13 = iVar13 + 1;
        pNVar5 = (this->action_vars_).
                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (iVar13 < (int)((ulong)((long)(pNVar5->super_Variable).values_.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     *(long *)&(pNVar5->super_Variable).values_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data) >> 5));
    }
    if (this->enable_selfloop_cache_ == true) {
      if (10000 < (this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pVar15 = std::
                 _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::equal_range(&this_00->_M_t,
                               (this->selfloop_state_queue_).c.
                               super__Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur);
        std::
        _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar15.first._M_node,
                       (_Base_ptr)pVar15.second._M_node);
        std::
        deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::pop_front(&(this->selfloop_state_queue_).c);
      }
      std::
      _Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::_M_insert_unique<std::vector<int,std::allocator<int>>const&>
                ((_Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)this_00,state);
      std::
      deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&(this->selfloop_state_queue_).c,state);
    }
  }
  return true;
}

Assistant:

bool Parser::IsSelfLoopingWithoutReward(const vector<int>& state) const {
	if (selfloop_state_set_.find(state) != selfloop_state_set_.end())
		return true;

	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
		curr_state_vars_[s].curr_value = state[s];
	}

	for (int a = 0; a < action_vars_[0].Size(); a++) {
		action_vars_[0].curr_value = a;

		for (int s = 0; s < state.size(); s++) {
			if (transition_funcs_[s]->GetValue(state[s]) != 1.0)
				return false;
		}

		for (int r = 0; r < reward_funcs_.size(); r++) {
			if (reward_funcs_[r].GetValue() != 0)
				return false;
		}
	}

	if (enable_selfloop_cache_) {
		if (selfloop_state_set_.size() > 10000) { // Replace the oldest state by the new one
			selfloop_state_set_.erase(selfloop_state_queue_.front());
			selfloop_state_queue_.pop();
		}

		selfloop_state_set_.insert(state);
		selfloop_state_queue_.push(state);
	}

	return true;
}